

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O2

bool __thiscall
SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SetMarker
          (BacktrackingTokenStream<SGParser::Generator::RegExprParseToken> *this,size_t markerIndex)

{
  StreamBlock *pSVar1;
  bool bVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  StreamBlock *local_20;
  StreamBlock *pblock;
  size_t markerIndex_local;
  
  pSVar1 = this->pFirstBlock;
  bVar2 = pSVar1->Index <= markerIndex;
  bVar5 = markerIndex <= this->Pos;
  bVar4 = bVar5 && bVar2;
  if (!bVar5 || !bVar2) {
    return bVar4;
  }
  local_20 = this->pThisBlock;
  if (local_20->Index <= markerIndex) {
    uVar3 = local_20->Index + local_20->Count;
    if ((markerIndex < uVar3) || (local_20->Count != 0x200 && uVar3 == markerIndex))
    goto LAB_00136b19;
  }
  do {
    local_20 = pSVar1;
    pSVar1 = local_20->pNext;
    if (pSVar1 == (StreamBlock *)0x0) break;
  } while (pSVar1->Index <= markerIndex);
LAB_00136b19:
  pblock = (StreamBlock *)markerIndex;
  std::
  map<unsigned_long,SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock*,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock*>>>
  ::
  insert_or_assign<SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock*&>
            ((map<unsigned_long,SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock*,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock*>>>
              *)&this->Markers,(key_type_conflict *)&pblock,&local_20);
  return bVar4;
}

Assistant:

bool BacktrackingTokenStream<Token>::SetMarker(size_t markerIndex) {
    if (markerIndex < pFirstBlock->Index || markerIndex > Pos)
        return false;

    StreamBlock* pblock;

    // Find a block marker would belong to
    if (pThisBlock->Index <= markerIndex &&
        (pThisBlock->Index + pThisBlock->Count > markerIndex ||
         (pThisBlock->Index + pThisBlock->Count == markerIndex &&
          pThisBlock->Count != StreamBlock::BufferSize)))
        pblock = pThisBlock;
    else {
        pblock = pFirstBlock;
        while (pblock->pNext && pblock->pNext->Index <= markerIndex)
            pblock = pblock->pNext;
    }
    // Add marker
    Markers.insert_or_assign(markerIndex, pblock);
    return true;
}